

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxDecoder.cpp
# Opt level: O0

void __thiscall
FluxDecoder::FluxDecoder
          (FluxDecoder *this,FluxData *flux_revs,int bitcell_ns,int flux_scale_percent,
          int pll_adjust)

{
  size_type sVar1;
  const_iterator cVar2;
  reference this_00;
  const_iterator cVar3;
  int pll_adjust_local;
  int flux_scale_percent_local;
  int bitcell_ns_local;
  FluxData *flux_revs_local;
  FluxDecoder *this_local;
  
  this->m_flux_revs = flux_revs;
  __gnu_cxx::
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::__normal_iterator(&this->m_rev_it);
  __gnu_cxx::
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::__normal_iterator(&this->m_flux_it);
  this->m_clock = bitcell_ns;
  this->m_clock_centre = bitcell_ns;
  this->m_clock_min = (bitcell_ns * (100 - pll_adjust)) / 100;
  this->m_clock_max = (bitcell_ns * (pll_adjust + 100)) / 100;
  this->m_flux = 0;
  this->m_clocked_zeros = 0;
  this->m_flux_scale_percent = flux_scale_percent;
  this->m_pll_adjust = pll_adjust;
  this->m_goodbits = 0;
  this->m_index = false;
  this->m_sync_lost = false;
  sVar1 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(flux_revs);
  if (sVar1 != 0) {
    cVar2 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::cbegin(this->m_flux_revs);
    (this->m_rev_it)._M_current = cVar2._M_current;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&this->m_rev_it);
    cVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(this_00);
    (this->m_flux_it)._M_current = cVar3._M_current;
    return;
  }
  __assert_fail("flux_revs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/FluxDecoder.cpp"
                ,0xf,"FluxDecoder::FluxDecoder(const FluxData &, int, int, int)");
}

Assistant:

FluxDecoder::FluxDecoder(const FluxData& flux_revs, int bitcell_ns, int flux_scale_percent, int pll_adjust)
    : m_flux_revs(flux_revs), m_clock(bitcell_ns), m_clock_centre(bitcell_ns),
    m_clock_min(bitcell_ns* (100 - pll_adjust) / 100),
    m_clock_max(bitcell_ns* (100 + pll_adjust) / 100),
    m_flux_scale_percent(flux_scale_percent),
    m_pll_adjust(pll_adjust)
{
    assert(flux_revs.size());

    m_rev_it = m_flux_revs.cbegin();
    m_flux_it = (*m_rev_it).cbegin();
}